

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbAddrModeImm5SOperand(MCInst *MI,uint Op,SStream *O,uint Scale)

{
  cs_struct *h;
  _Bool _Var1;
  uint uVar2;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar3;
  uint tmp;
  uint ImmOffs;
  MCOperand *MO2;
  MCOperand *MO1;
  uint Scale_local;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  op_00 = MCInst_getOperand(MI,Op + 1);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    SStream_concat0(O,"[");
    set_mem_access(MI,true);
    h = MI->csh;
    uVar2 = MCOperand_getReg(op);
    printRegName(h,O,uVar2);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar2 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar2;
    }
    iVar3 = MCOperand_getImm(op_00);
    if ((int)iVar3 != 0) {
      uVar2 = (int)iVar3 * Scale;
      SStream_concat0(O,", ");
      if (uVar2 < 10) {
        SStream_concat(O,"#%u",(ulong)uVar2);
      }
      else {
        SStream_concat(O,"#0x%x",(ulong)uVar2);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = uVar2;
      }
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  else {
    printOperand(MI,Op,O);
  }
  return;
}

Assistant:

static void printThumbAddrModeImm5SOperand(MCInst *MI, unsigned Op, SStream *O,
		unsigned Scale)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned ImmOffs, tmp;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	ImmOffs = (unsigned int)MCOperand_getImm(MO2);
	if (ImmOffs) {
		tmp = ImmOffs * Scale;
		SStream_concat0(O, ", ");
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, "#0x%x", tmp);
		else
			SStream_concat(O, "#%u", tmp);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = tmp;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}